

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O0

ParserOptions * __thiscall duckdb::ClientContext::GetParserOptions(ClientContext *this)

{
  ClientConfig *pCVar1;
  DBConfig *pDVar2;
  ClientContext *in_RSI;
  ParserOptions *in_RDI;
  ClientConfig *client_config;
  
  pCVar1 = ClientConfig::GetConfig(in_RSI);
  ParserOptions::ParserOptions(in_RDI);
  in_RDI->preserve_identifier_case = (bool)(pCVar1->preserve_identifier_case & 1);
  in_RDI->integer_division = (bool)(pCVar1->integer_division & 1);
  in_RDI->max_expression_depth = pCVar1->max_expression_depth;
  pDVar2 = DBConfig::GetConfig((ClientContext *)0x86ee9f);
  in_RDI->extensions = &pDVar2->parser_extensions;
  return in_RDI;
}

Assistant:

ParserOptions ClientContext::GetParserOptions() const {
	auto &client_config = ClientConfig::GetConfig(*this);
	ParserOptions options;
	options.preserve_identifier_case = client_config.preserve_identifier_case;
	options.integer_division = client_config.integer_division;
	options.max_expression_depth = client_config.max_expression_depth;
	options.extensions = &DBConfig::GetConfig(*this).parser_extensions;
	return options;
}